

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_module.cpp
# Opt level: O2

Id __thiscall
dxil_spv::SPIRVModule::Impl::build_image_atomic_r64_compact
          (Impl *this,SPIRVModule *module,bool array,bool non_uniform)

{
  Builder *pBVar1;
  pointer ppIVar2;
  Instruction *pIVar3;
  Block *pBVar4;
  _Head_base<0UL,_spv::Instruction_*,_false> _Var5;
  ulong uVar6;
  Id IVar7;
  Id IVar8;
  Id IVar9;
  Id returnType;
  Function *parent;
  Block *pBVar10;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  char *pcVar11;
  pointer *__ptr;
  Instruction *local_1a8;
  Id local_1a0;
  Id bool_type;
  Instruction *local_198;
  _Head_base<0UL,_spv::Instruction_*,_false> local_190;
  _Head_base<0UL,_spv::Instruction_*,_false> local_188;
  Block *local_180;
  Block *local_178;
  Instruction *local_170;
  _Head_base<0UL,_spv::Instruction_*,_false> local_168;
  Id local_160;
  Id u64_type;
  Block *local_158;
  _Head_base<0UL,_spv::Instruction_*,_false> local_150;
  Id local_148;
  Id local_144;
  uint local_140;
  Id ptr_atomic_type;
  Id bvec_type;
  Id coord_type;
  _Head_base<0UL,_spv::Instruction_*,_false> local_130;
  Id local_128;
  Id local_124;
  Block *local_120;
  Block *local_118;
  Block *local_110;
  Builder *local_108;
  Block *entry;
  vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  local_f8;
  Block *local_e0;
  Block *local_d8;
  undefined8 local_d0;
  Block *local_c8;
  Function *local_c0;
  Block *local_b8;
  ulong local_b0;
  _Head_base<0UL,_spv::Instruction_*,_false> local_a8;
  _Head_base<0UL,_spv::Instruction_*,_false> local_a0;
  _Head_base<0UL,_spv::Instruction_*,_false> local_98;
  _Head_base<0UL,_spv::Instruction_*,_false> local_90;
  _Head_base<0UL,_spv::Instruction_*,_false> local_88;
  _Head_base<0UL,_spv::Instruction_*,_false> local_80;
  _Head_base<0UL,_spv::Instruction_*,_false> local_78;
  undefined4 local_6c;
  _Head_base<0UL,_spv::Instruction_*,_false> local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  _Head_base<0UL,_spv::Instruction_*,_false> local_48;
  _Head_base<0UL,_spv::Instruction_*,_false> local_40;
  _Head_base<0UL,_spv::Instruction_*,_false> local_38;
  
  local_d0 = CONCAT71(in_register_00000009,non_uniform);
  local_b0 = (ulong)(uint)((int)CONCAT71(in_register_00000011,array) * 4 + (int)local_d0 * 8);
  IVar7 = *(Id *)((long)&this->image_r64_atomic_call_id + local_b0);
  if (IVar7 == 0) {
    pcVar11 = "WriteFeedbackArray";
    if (non_uniform) {
      pcVar11 = "WriteFeedbackArrayNonUniform";
    }
    local_178 = (Block *)0x1a87be;
    if (non_uniform) {
      local_178 = (Block *)0x1a87a6;
    }
    if (array) {
      local_178 = (Block *)pcVar11;
    }
    pBVar1 = &this->builder;
    spv::Builder::addCapability(pBVar1,CapabilityGroupNonUniform);
    spv::Builder::addCapability(pBVar1,CapabilityGroupNonUniformBallot);
    spv::Builder::addCapability(pBVar1,CapabilityGroupNonUniformArithmetic);
    local_b8 = (this->builder).buildPoint;
    IVar7 = spv::Builder::makeUintType(pBVar1,0x40);
    IVar7 = spv::Builder::makeImageType(pBVar1,IVar7,Dim2D,false,array,false,2,ImageFormatR64ui);
    IVar7 = spv::Builder::makePointer(pBVar1,StorageClassUniformConstant,IVar7);
    local_180 = (Block *)CONCAT44(local_180._4_4_,IVar7);
    entry = (Block *)0x0;
    IVar7 = spv::Builder::makeBoolType(pBVar1);
    bool_type = IVar7;
    IVar8 = spv::Builder::makeIntType(pBVar1,0x20);
    IVar8 = spv::Builder::makeVectorType(pBVar1,IVar8,array | 2);
    coord_type = IVar8;
    bvec_type = spv::Builder::makeVectorType(pBVar1,IVar7,array | 2);
    IVar9 = spv::Builder::makeUintType(pBVar1,0x40);
    u64_type = IVar9;
    ptr_atomic_type = spv::Builder::makePointer(pBVar1,StorageClassImage,IVar9);
    returnType = spv::Builder::makeVoidType(pBVar1);
    local_130._M_head_impl._0_4_ = (Id)local_180;
    local_68._M_head_impl = (Instruction *)0x0;
    uStack_60 = 0;
    local_58 = 0;
    local_128 = IVar9;
    local_124 = IVar7;
    local_130._M_head_impl._4_4_ = IVar8;
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_range_initialize<unsigned_int_const*>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)&local_68,
               &local_130);
    local_f8.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_f8.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_f8.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    parent = spv::Builder::makeFunctionEntry
                       (pBVar1,DecorationMax,returnType,(char *)local_178,(Vector<Id> *)&local_68,
                        &local_f8,&entry);
    std::
    vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ::~vector(&local_f8);
    std::_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)
               &local_68);
    ppIVar2 = (parent->parameterInstructions).
              super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_144 = (*ppIVar2)->resultId;
    IVar7 = ppIVar2[1]->resultId;
    IVar8 = ppIVar2[2]->resultId;
    IVar9 = ppIVar2[3]->resultId;
    spv::Builder::addName(pBVar1,local_144,"img");
    local_160 = IVar7;
    spv::Builder::addName(pBVar1,IVar7,"coord");
    local_1a0 = IVar8;
    spv::Builder::addName(pBVar1,IVar8,"value");
    spv::Builder::addName(pBVar1,IVar9,"active_lane");
    local_178 = (Block *)allocate_in_thread(0x78);
    IVar7 = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = IVar7;
    spv::Block::Block(local_178,IVar7,parent);
    pBVar10 = (Block *)allocate_in_thread(0x78);
    IVar7 = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = IVar7;
    spv::Block::Block(pBVar10,IVar7,parent);
    local_110 = (Block *)allocate_in_thread(0x78);
    IVar7 = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = IVar7;
    spv::Block::Block(local_110,IVar7,parent);
    local_e0 = (Block *)allocate_in_thread(0x78);
    IVar7 = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = IVar7;
    spv::Block::Block(local_e0,IVar7,parent);
    local_118 = (Block *)allocate_in_thread(0x78);
    IVar7 = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = IVar7;
    spv::Block::Block(local_118,IVar7,parent);
    local_120 = (Block *)allocate_in_thread(0x78);
    IVar7 = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = IVar7;
    spv::Block::Block(local_120,IVar7,parent);
    local_180 = (Block *)allocate_in_thread(0x78);
    IVar7 = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = IVar7;
    spv::Block::Block(local_180,IVar7,parent);
    local_158 = (Block *)allocate_in_thread(0x78);
    IVar7 = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = IVar7;
    spv::Block::Block(local_158,IVar7,parent);
    local_d8 = (Block *)allocate_in_thread(0x78);
    IVar7 = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = IVar7;
    local_c0 = parent;
    spv::Block::Block(local_d8,IVar7,parent);
    (this->builder).buildPoint = entry;
    spv::Builder::createSelectionMerge(pBVar1,pBVar10,0);
    pBVar4 = local_178;
    local_c8 = pBVar10;
    spv::Builder::createConditionalBranch(pBVar1,IVar9,local_178,pBVar10);
    IVar7 = bool_type;
    IVar8 = spv::Builder::makeBoolConstant(pBVar1,false,false);
    local_108 = pBVar1;
    IVar8 = spv::Builder::createVariableWithInitializer
                      (pBVar1,StorageClassFunction,IVar7,IVar8,"is_done");
    (this->builder).buildPoint = pBVar4;
    IVar7 = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = IVar7;
    local_f8.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_f8.
                           super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,IVar7);
    local_130._M_head_impl._0_4_ = 0x3d;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_68,(uint *)&local_f8,&bool_type);
    local_130._M_head_impl._0_4_ = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = (Id)local_130._M_head_impl;
    local_168._M_head_impl._0_4_ = 0xa8;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_f8,(uint *)&local_130,&bool_type);
    IVar7 = *(Id *)((long)local_f8.
                          super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + 8);
    local_148 = IVar8;
    spv::Instruction::addIdOperand(local_68._M_head_impl,IVar8);
    spv::Instruction::addIdOperand
              ((Instruction *)
               local_f8.
               super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,(local_68._M_head_impl)->resultId);
    local_78._M_head_impl = local_68._M_head_impl;
    local_68._M_head_impl = (Instruction *)0x0;
    add_instruction(this,pBVar4,
                    (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                    &local_78);
    if (local_78._M_head_impl != (Instruction *)0x0) {
      (*(local_78._M_head_impl)->_vptr_Instruction[1])();
    }
    local_78._M_head_impl = (Instruction *)0x0;
    local_80._M_head_impl =
         (Instruction *)
         local_f8.
         super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_f8.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    add_instruction(this,local_178,
                    (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                    &local_80);
    if (local_80._M_head_impl != (Instruction *)0x0) {
      (*(local_80._M_head_impl)->_vptr_Instruction[1])();
    }
    pBVar1 = local_108;
    pBVar4 = local_110;
    local_80._M_head_impl = (Instruction *)0x0;
    spv::Builder::createLoopMerge(local_108,local_110,local_118,0);
    pBVar10 = local_e0;
    spv::Builder::createConditionalBranch(pBVar1,IVar7,local_e0,pBVar4);
    (this->builder).buildPoint = pBVar10;
    IVar7 = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = IVar7;
    local_168._M_head_impl._0_4_ = IVar7;
    local_188._M_head_impl._0_4_ = 0x152;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_130,(uint *)&local_168,&coord_type);
    local_188._M_head_impl._0_4_ = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = (Id)local_188._M_head_impl;
    local_190._M_head_impl._0_4_ = 0xaa;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_168,(uint *)&local_188,&bvec_type);
    local_190._M_head_impl._0_4_ = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = (Id)local_190._M_head_impl;
    local_150._M_head_impl._0_4_ = 0x9b;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_188,(uint *)&local_190,&bool_type);
    local_150._M_head_impl._0_4_ = 0x3e;
    std::make_unique<spv::Instruction,spv::Op>((Op *)&local_190);
    _Var5._M_head_impl = local_130._M_head_impl;
    IVar7 = spv::Builder::makeUintConstant(pBVar1,3,false);
    spv::Instruction::addIdOperand(_Var5._M_head_impl,IVar7);
    IVar7 = local_160;
    spv::Instruction::addIdOperand(local_130._M_head_impl,local_160);
    spv::Instruction::addIdOperand(local_168._M_head_impl,IVar7);
    spv::Instruction::addIdOperand(local_168._M_head_impl,(local_130._M_head_impl)->resultId);
    spv::Instruction::addIdOperand(local_188._M_head_impl,(local_168._M_head_impl)->resultId);
    spv::Instruction::addIdOperand(local_190._M_head_impl,local_148);
    spv::Instruction::addIdOperand(local_190._M_head_impl,(local_188._M_head_impl)->resultId);
    IVar7 = (local_188._M_head_impl)->resultId;
    local_88._M_head_impl = local_130._M_head_impl;
    local_130._M_head_impl = (Instruction *)0x0;
    add_instruction(this,pBVar10,
                    (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                    &local_88);
    if (local_88._M_head_impl != (Instruction *)0x0) {
      (*(local_88._M_head_impl)->_vptr_Instruction[1])();
    }
    local_88._M_head_impl = (Instruction *)0x0;
    local_90._M_head_impl = local_168._M_head_impl;
    local_168._M_head_impl = (Instruction *)0x0;
    add_instruction(this,pBVar10,
                    (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                    &local_90);
    if (local_90._M_head_impl != (Instruction *)0x0) {
      (*(local_90._M_head_impl)->_vptr_Instruction[1])();
    }
    local_90._M_head_impl = (Instruction *)0x0;
    local_98._M_head_impl = local_188._M_head_impl;
    local_188._M_head_impl = (Instruction *)0x0;
    add_instruction(this,pBVar10,
                    (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                    &local_98);
    pBVar1 = local_108;
    if (local_98._M_head_impl != (Instruction *)0x0) {
      (*(local_98._M_head_impl)->_vptr_Instruction[1])();
    }
    local_98._M_head_impl = (Instruction *)0x0;
    local_a0._M_head_impl = local_190._M_head_impl;
    local_190._M_head_impl = (Instruction *)0x0;
    add_instruction(this,pBVar10,
                    (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                    &local_a0);
    if (local_a0._M_head_impl != (Instruction *)0x0) {
      (*(local_a0._M_head_impl)->_vptr_Instruction[1])();
    }
    pBVar4 = local_180;
    local_a0._M_head_impl = (Instruction *)0x0;
    spv::Builder::createSelectionMerge(pBVar1,local_180,0);
    pBVar10 = local_120;
    spv::Builder::createConditionalBranch(pBVar1,IVar7,local_120,pBVar4);
    (this->builder).buildPoint = pBVar10;
    IVar7 = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = IVar7;
    local_198 = (Instruction *)CONCAT44(local_198._4_4_,IVar7);
    local_1a8._0_4_ = 0x168;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_150,(uint *)&local_198,&u64_type);
    IVar7 = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = IVar7;
    local_1a8 = (Instruction *)CONCAT44(local_1a8._4_4_,IVar7);
    local_170 = (Instruction *)CONCAT44(local_170._4_4_,0x14d);
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_198,(uint *)&local_1a8,&bool_type);
    _Var5._M_head_impl = local_150._M_head_impl;
    IVar7 = spv::Builder::makeUintConstant(pBVar1,3,false);
    spv::Instruction::addIdOperand(_Var5._M_head_impl,IVar7);
    spv::Instruction::addImmediateOperand(local_150._M_head_impl,0);
    spv::Instruction::addIdOperand(local_150._M_head_impl,local_1a0);
    pIVar3 = local_198;
    IVar7 = spv::Builder::makeUintConstant(pBVar1,3,false);
    spv::Instruction::addIdOperand(pIVar3,IVar7);
    IVar7 = local_198->resultId;
    local_1a0 = (local_150._M_head_impl)->resultId;
    local_a8._M_head_impl = local_150._M_head_impl;
    local_150._M_head_impl = (Instruction *)0x0;
    add_instruction(this,pBVar10,
                    (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                    &local_a8);
    if (local_a8._M_head_impl != (Instruction *)0x0) {
      (*(local_a8._M_head_impl)->_vptr_Instruction[1])();
    }
    local_a8._M_head_impl = (Instruction *)0x0;
    local_38._M_head_impl = local_198;
    local_198 = (Instruction *)0x0;
    add_instruction(this,local_120,
                    (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                    &local_38);
    if (local_38._M_head_impl != (Instruction *)0x0) {
      (*(local_38._M_head_impl)->_vptr_Instruction[1])();
    }
    pBVar10 = local_d8;
    spv::Builder::createSelectionMerge(pBVar1,local_d8,0);
    pBVar4 = local_158;
    spv::Builder::createConditionalBranch(pBVar1,IVar7,local_158,pBVar10);
    (this->builder).buildPoint = pBVar4;
    IVar7 = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = IVar7;
    local_170 = (Instruction *)CONCAT44(local_170._4_4_,IVar7);
    local_140 = 0x3c;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_1a8,(uint *)&local_170,&ptr_atomic_type);
    if ((char)local_d0 != '\0') {
      spv::Builder::addDecoration(pBVar1,local_1a8->resultId,DecorationNonUniform,-1);
    }
    local_140 = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = local_140;
    local_6c = 0xf1;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_170,&local_140,&u64_type);
    spv::Instruction::addIdOperand(local_1a8,local_144);
    spv::Instruction::addIdOperand(local_1a8,local_160);
    pIVar3 = local_1a8;
    IVar7 = spv::Builder::makeIntConstant(pBVar1,0,false);
    spv::Instruction::addIdOperand(pIVar3,IVar7);
    spv::Instruction::addIdOperand(local_170,local_1a8->resultId);
    pIVar3 = local_170;
    IVar7 = spv::Builder::makeUintConstant(pBVar1,1,false);
    spv::Instruction::addIdOperand(pIVar3,IVar7);
    pIVar3 = local_170;
    IVar7 = spv::Builder::makeUintConstant(pBVar1,0,false);
    spv::Instruction::addIdOperand(pIVar3,IVar7);
    spv::Instruction::addIdOperand(local_170,local_1a0);
    local_40._M_head_impl = local_1a8;
    local_1a8 = (Instruction *)0x0;
    add_instruction(this,local_158,
                    (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                    &local_40);
    if (local_40._M_head_impl != (Instruction *)0x0) {
      (*(local_40._M_head_impl)->_vptr_Instruction[1])();
    }
    local_48._M_head_impl = local_170;
    local_170 = (Instruction *)0x0;
    add_instruction(this,local_158,
                    (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                    &local_48);
    pBVar4 = local_c8;
    if (local_48._M_head_impl != (Instruction *)0x0) {
      (*(local_48._M_head_impl)->_vptr_Instruction[1])();
    }
    spv::Builder::createBranch(pBVar1,pBVar10);
    uVar6 = local_b0;
    if (local_170 != (Instruction *)0x0) {
      (*local_170->_vptr_Instruction[1])();
    }
    if (local_1a8 != (Instruction *)0x0) {
      (*local_1a8->_vptr_Instruction[1])();
    }
    (this->builder).buildPoint = pBVar10;
    spv::Builder::createBranch(pBVar1,local_180);
    if (local_198 != (Instruction *)0x0) {
      (*local_198->_vptr_Instruction[1])();
    }
    if (local_150._M_head_impl != (Instruction *)0x0) {
      (*(local_150._M_head_impl)->_vptr_Instruction[1])();
    }
    pBVar10 = local_118;
    (this->builder).buildPoint = local_180;
    spv::Builder::createBranch(pBVar1,local_118);
    (this->builder).buildPoint = pBVar10;
    spv::Builder::createBranch(pBVar1,local_178);
    if (local_190._M_head_impl != (Instruction *)0x0) {
      (*(local_190._M_head_impl)->_vptr_Instruction[1])();
    }
    if (local_188._M_head_impl != (Instruction *)0x0) {
      (*(local_188._M_head_impl)->_vptr_Instruction[1])();
    }
    if (local_168._M_head_impl != (Instruction *)0x0) {
      (*(local_168._M_head_impl)->_vptr_Instruction[1])();
    }
    if (local_130._M_head_impl != (Instruction *)0x0) {
      (*(local_130._M_head_impl)->_vptr_Instruction[1])();
    }
    (this->builder).buildPoint = local_110;
    spv::Builder::createBranch(pBVar1,pBVar4);
    if (local_f8.
        super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)local_f8.
                            super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + 8))();
    }
    if (local_68._M_head_impl != (Instruction *)0x0) {
      (*(local_68._M_head_impl)->_vptr_Instruction[1])();
    }
    (this->builder).buildPoint = pBVar4;
    spv::Builder::makeReturn(pBVar1,false,0);
    spv::Builder::addCapability(pBVar1,CapabilityInt64Atomics);
    (this->builder).buildPoint = local_b8;
    IVar7 = (local_c0->functionInstruction).resultId;
    *(Id *)((long)&this->image_r64_atomic_call_id + uVar6) = IVar7;
  }
  return IVar7;
}

Assistant:

spv::Id SPIRVModule::Impl::build_image_atomic_r64_compact(
	SPIRVModule &module, bool array, bool non_uniform)
{
	spv::Id *call_id;
	const char *name;
	if (array)
	{
		if (non_uniform)
		{
			call_id = &image_r64_array_atomic_non_uniform_call_id;
			name = "WriteFeedbackArrayNonUniform";
		}
		else
		{
			call_id = &image_r64_array_atomic_call_id;
			name = "WriteFeedbackArray";
		}
	}
	else
	{
		if (non_uniform)
		{
			call_id = &image_r64_atomic_non_uniform_call_id;
			name = "WriteFeedbackNonUniform";
		}
		else
		{
			call_id = &image_r64_atomic_call_id;
			name = "WriteFeedback";
		}
	}

	if (*call_id)
		return *call_id;

	builder.addCapability(spv::CapabilityGroupNonUniform);
	builder.addCapability(spv::CapabilityGroupNonUniformBallot);
	builder.addCapability(spv::CapabilityGroupNonUniformArithmetic);
	auto *current_build_point = builder.getBuildPoint();

	spv::Id image_type = builder.makeImageType(builder.makeUintType(64),
	                                           spv::Dim2D, false, array, false, 2, spv::ImageFormatR64ui);
	spv::Id ptr_image_type = builder.makePointer(spv::StorageClassUniformConstant, image_type);

	spv::Block *entry = nullptr;
	spv::Id bool_type = builder.makeBoolType();
	spv::Id int_type = builder.makeIntType(32);
	spv::Id coord_type = builder.makeVectorType(int_type, array ? 3 : 2);
	spv::Id bvec_type = builder.makeVectorType(bool_type, array ? 3 : 2);
	spv::Id u64_type = builder.makeUintType(64);
	spv::Id ptr_atomic_type = builder.makePointer(spv::StorageClassImage, u64_type);
	auto *func = builder.makeFunctionEntry(spv::NoPrecision, builder.makeVoidType(), name,
	                                       { ptr_image_type, coord_type, u64_type, bool_type }, {}, &entry);

	spv::Id image_ptr = func->getParamId(0);
	spv::Id coord = func->getParamId(1);
	spv::Id value = func->getParamId(2);
	spv::Id active = func->getParamId(3);

	builder.addName(image_ptr, "img");
	builder.addName(coord, "coord");
	builder.addName(value, "value");
	builder.addName(active, "active_lane");

	auto *body_block = new spv::Block(builder.getUniqueId(), *func);
	auto *merge_block = new spv::Block(builder.getUniqueId(), *func);
	auto *loop_merge_block = new spv::Block(builder.getUniqueId(), *func);
	auto *loop_body_block = new spv::Block(builder.getUniqueId(), *func);
	auto *loop_continue_block = new spv::Block(builder.getUniqueId(), *func);
	auto *write_block = new spv::Block(builder.getUniqueId(), *func);
	auto *write_merge_block = new spv::Block(builder.getUniqueId(), *func);
	auto *elect_block = new spv::Block(builder.getUniqueId(), *func);
	auto *elect_merge_block = new spv::Block(builder.getUniqueId(), *func);

	builder.setBuildPoint(entry);
	builder.createSelectionMerge(merge_block, 0);
	builder.createConditionalBranch(active, body_block, merge_block);

	spv::Id var_is_done = builder.createVariableWithInitializer(spv::StorageClassFunction, bool_type,
	                                                            builder.makeBoolConstant(false), "is_done");

	builder.setBuildPoint(body_block);
	{
		auto load = std::make_unique<spv::Instruction>(builder.getUniqueId(), bool_type, spv::OpLoad);
		auto inot = std::make_unique<spv::Instruction>(builder.getUniqueId(), bool_type, spv::OpLogicalNot);
		spv::Id inot_id = inot->getResultId();
		load->addIdOperand(var_is_done);
		inot->addIdOperand(load->getResultId());
		add_instruction(body_block, std::move(load));
		add_instruction(body_block, std::move(inot));
		builder.createLoopMerge(loop_merge_block, loop_continue_block, 0);
		builder.createConditionalBranch(inot_id, loop_body_block, loop_merge_block);

		builder.setBuildPoint(loop_body_block);
		{
			auto first = std::make_unique<spv::Instruction>(builder.getUniqueId(), coord_type, spv::OpGroupNonUniformBroadcastFirst);
			auto compare_coord = std::make_unique<spv::Instruction>(builder.getUniqueId(), bvec_type, spv::OpIEqual);
			auto all_equal = std::make_unique<spv::Instruction>(builder.getUniqueId(), bool_type, spv::OpAll);
			auto store = std::make_unique<spv::Instruction>(spv::OpStore);

			first->addIdOperand(builder.makeUintConstant(spv::ScopeSubgroup));
			first->addIdOperand(coord);
			compare_coord->addIdOperand(coord);
			compare_coord->addIdOperand(first->getResultId());
			all_equal->addIdOperand(compare_coord->getResultId());
			store->addIdOperand(var_is_done);
			store->addIdOperand(all_equal->getResultId());

			spv::Id cond_id = all_equal->getResultId();
			add_instruction(loop_body_block, std::move(first));
			add_instruction(loop_body_block, std::move(compare_coord));
			add_instruction(loop_body_block, std::move(all_equal));
			add_instruction(loop_body_block, std::move(store));

			builder.createSelectionMerge(write_merge_block, 0);
			builder.createConditionalBranch(cond_id, write_block, write_merge_block);
			builder.setBuildPoint(write_block);
			{
				auto or_op = std::make_unique<spv::Instruction>(builder.getUniqueId(), u64_type, spv::OpGroupNonUniformBitwiseOr);
				auto elect = std::make_unique<spv::Instruction>(builder.getUniqueId(), bool_type, spv::OpGroupNonUniformElect);
				or_op->addIdOperand(builder.makeUintConstant(spv::ScopeSubgroup));
				or_op->addImmediateOperand(spv::GroupOperationReduce);
				or_op->addIdOperand(value);
				elect->addIdOperand(builder.makeUintConstant(spv::ScopeSubgroup));
				spv::Id elect_id = elect->getResultId();
				spv::Id or_op_id = or_op->getResultId();
				add_instruction(write_block, std::move(or_op));
				add_instruction(write_block, std::move(elect));

				builder.createSelectionMerge(elect_merge_block, 0);
				builder.createConditionalBranch(elect_id, elect_block, elect_merge_block);
				builder.setBuildPoint(elect_block);
				{
					auto texel = std::make_unique<spv::Instruction>(builder.getUniqueId(), ptr_atomic_type, spv::OpImageTexelPointer);
					if (non_uniform)
						builder.addDecoration(texel->getResultId(), spv::DecorationNonUniform);
					auto atomic_op = std::make_unique<spv::Instruction>(builder.getUniqueId(), u64_type, spv::OpAtomicOr);
					texel->addIdOperand(image_ptr);
					texel->addIdOperand(coord);
					texel->addIdOperand(builder.makeIntConstant(0));
					atomic_op->addIdOperand(texel->getResultId());
					atomic_op->addIdOperand(builder.makeUintConstant(spv::ScopeDevice));
					atomic_op->addIdOperand(builder.makeUintConstant(0));
					atomic_op->addIdOperand(or_op_id);
					add_instruction(elect_block, std::move(texel));
					add_instruction(elect_block, std::move(atomic_op));
					builder.createBranch(elect_merge_block);
				}

				builder.setBuildPoint(elect_merge_block);
				builder.createBranch(write_merge_block);
			}

			builder.setBuildPoint(write_merge_block);
			builder.createBranch(loop_continue_block);

			builder.setBuildPoint(loop_continue_block);
			builder.createBranch(body_block);
		}

		builder.setBuildPoint(loop_merge_block);
		builder.createBranch(merge_block);
	}

	builder.setBuildPoint(merge_block);
	builder.makeReturn(false);

	builder.addCapability(spv::CapabilityInt64Atomics);

	builder.setBuildPoint(current_build_point);
	*call_id = func->getId();
	return func->getId();
}